

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplace_back<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  ulong uVar1;
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *p;
  char *pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *pSVar5;
  size_t *psVar6;
  size_t *psVar7;
  long lVar8;
  long lVar9;
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *__src;
  ulong uVar10;
  long lVar11;
  
  __src = (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)
          (*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    pcVar2 = args->_M_str;
    *(size_t *)__src = args->_M_len;
    *(char **)(__src + 8) = pcVar2;
    lVar8 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar8 + 1;
    return (reference)(*(long *)this + (lVar8 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar10 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar10 < uVar1 * 2) {
    uVar10 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar10 = 0x7ffffffffffffff;
  }
  lVar11 = (long)__src - *(long *)this;
  psVar7 = (size_t *)operator_new(uVar10 << 4);
  pcVar2 = args->_M_str;
  *(size_t *)((long)psVar7 + lVar11) = args->_M_len;
  ((size_t *)((long)psVar7 + lVar11))[1] = (size_t)pcVar2;
  p = *(SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> **)this;
  lVar8 = *(long *)(this + 8) * 0x10;
  pSVar5 = p;
  psVar6 = psVar7;
  if (p + (lVar8 - (long)__src) ==
      (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)0x0) {
    if (*(long *)(this + 8) != 0) {
      lVar9 = 0;
      do {
        uVar4 = *(undefined8 *)(p + lVar9 + 8);
        *(undefined8 *)((long)psVar7 + lVar9) = *(undefined8 *)(p + lVar9);
        ((undefined8 *)((long)psVar7 + lVar9))[1] = uVar4;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 != lVar9);
    }
  }
  else {
    for (; pSVar5 != __src; pSVar5 = pSVar5 + 0x10) {
      sVar3 = *(size_t *)(pSVar5 + 8);
      *psVar6 = *(size_t *)pSVar5;
      psVar6[1] = sVar3;
      psVar6 = psVar6 + 2;
    }
    memcpy((void *)((long)psVar7 + lVar11 + 0x10),__src,
           ((ulong)(p + (lVar8 - (long)__src) + -0x10) & 0xfffffffffffffff0) + 0x10);
  }
  if (p != this + 0x18) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar10;
  *(size_t **)this = psVar7;
  return (reference)((long)psVar7 + lVar11);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }